

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_compress_fast_extState_fastReset
              (void *state,char *src,char *dst,int srcSize,int dstCapacity,int acceleration)

{
  int iVar1;
  short sVar2;
  char cVar3;
  uint uVar4;
  ulong uVar5;
  int *piVar6;
  int *piVar7;
  char *pcVar8;
  ulong uVar9;
  char *pcVar10;
  int iVar11;
  long *plVar12;
  long lVar13;
  int *piVar14;
  ulong *puVar15;
  BYTE *e;
  short *psVar16;
  ushort uVar17;
  int iVar18;
  ulong *puVar19;
  int *piVar20;
  int *piVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  short *psVar25;
  long *plVar26;
  char cVar27;
  short *psVar28;
  long lVar29;
  long *plVar30;
  char *__s;
  char *pcVar31;
  ulong uVar32;
  uint uVar33;
  BYTE *s_1;
  long lVar34;
  BYTE *s_3;
  long *plVar35;
  ulong *puVar36;
  BYTE *s;
  long lVar37;
  long *plVar38;
  BYTE *e_5;
  ulong *puVar39;
  int *local_b8;
  short *local_b0;
  U16 *hashTable;
  
  if (acceleration < 2) {
    acceleration = 1;
  }
  if (0x10000 < acceleration) {
    acceleration = 0x10001;
  }
  iVar11 = 0;
  if ((uint)srcSize < 0x7e000001) {
    iVar11 = srcSize + (uint)srcSize / 0xff + 0x10;
  }
  iVar22 = *(int *)((long)state + 0x4004);
  sVar2 = (short)src;
  iVar18 = (int)dst;
  local_b8 = (int *)src;
  if (iVar11 <= dstCapacity) {
    if (0x1000a < srcSize) {
      if (iVar22 == 0) {
        if (*(int *)((long)state + 0x4000) == 0) {
          uVar23 = 0;
        }
        else {
          uVar23 = *(int *)((long)state + 0x4000) + 0x10000;
          *(uint *)((long)state + 0x4000) = uVar23;
        }
      }
      else {
        uVar23 = 0;
        memset(state,0,0x4008);
      }
      *(undefined4 *)((long)state + 0x4018) = 0;
      *(undefined8 *)((long)state + 0x4008) = 0;
      *(undefined8 *)((long)state + 0x4010) = 0;
      if (0x7e000000 < (uint)srcSize) {
        return 0;
      }
      lVar34 = (long)src - (ulong)uVar23;
      plVar26 = (long *)(src + ((ulong)(uint)srcSize - 0xb));
      *(int *)((long)state + 0x4018) = srcSize;
      *(uint *)((long)state + 0x4000) = srcSize + uVar23;
      *(undefined4 *)((long)state + 0x4004) = 2;
      *(uint *)((long)state + ((ulong)(*(long *)src * -0x30e4432345000000) >> 0x34) * 4) = uVar23;
      plVar38 = (long *)(src + 2);
      plVar35 = (long *)src;
LAB_00119b57:
      lVar37 = *(long *)((long)plVar35 + 1);
      plVar30 = (long *)((long)plVar35 + 1);
      uVar4 = acceleration;
      uVar23 = acceleration * 0x40;
      while( true ) {
        uVar23 = uVar23 + 1;
        uVar9 = (ulong)(lVar37 * -0x30e4432345000000) >> 0x34;
        uVar24 = *(uint *)((long)state + uVar9 * 4);
        iVar11 = (int)lVar34;
        uVar33 = (int)plVar30 - iVar11;
        lVar37 = *plVar38;
        *(uint *)((long)state + uVar9 * 4) = uVar33;
        if ((uVar33 <= uVar24 + 0xffff) && (*(int *)(lVar34 + (ulong)uVar24) == (int)*plVar30))
        break;
        plVar12 = (long *)((ulong)uVar4 + (long)plVar38);
        uVar4 = uVar23 >> 6;
        plVar30 = plVar38;
        plVar38 = plVar12;
        if (plVar26 < plVar12) goto LAB_00119edf;
      }
      lVar13 = (ulong)uVar24 + lVar34;
      iVar22 = (int)plVar30 - (int)plVar35;
      lVar37 = 0;
      cVar3 = (char)plVar30 * '\x10' + (char)plVar35 * -0x10;
      uVar23 = iVar22 - 0xfU;
      do {
        uVar4 = uVar23;
        cVar27 = cVar3;
        lVar29 = lVar37;
        piVar20 = (int *)(lVar13 + lVar29);
        plVar38 = (long *)((long)plVar30 + lVar29);
        if ((piVar20 <= src) || (plVar38 <= plVar35)) break;
        lVar37 = lVar29 + -1;
        cVar3 = cVar27 + -0x10;
        uVar23 = uVar4 - 1;
      } while (*(char *)((long)plVar30 + lVar29 + -1) == *(char *)(lVar13 + -1 + lVar29));
      iVar1 = (int)lVar29;
      plVar30 = (long *)(dst + 1);
      if ((uint)(iVar22 + iVar1) < 0xf) {
        *dst = cVar27;
      }
      else {
        uVar9 = (ulong)(iVar22 - 0xfU) + lVar29;
        *dst = -0x10;
        if (0xfe < (int)uVar9) {
          uVar23 = 0x1fd;
          if (uVar4 < 0x1fd) {
            uVar23 = uVar4;
          }
          if (0x1fc < (int)uVar4) {
            uVar4 = 0x1fd;
          }
          memset(plVar30,0xff,(ulong)((((iVar22 + 0xef) - uVar23) + iVar1) / 0xff + 1));
          uVar23 = ((iVar22 + 0xef) - uVar4) + iVar1;
          plVar30 = (long *)(dst + (ulong)uVar23 / 0xff + 2);
          uVar9 = (ulong)(iVar22 + -0x10e + iVar1 + (uVar23 % 0xff - uVar23));
        }
        *(char *)plVar30 = (char)uVar9;
        plVar30 = (long *)((long)plVar30 + 1);
      }
      plVar12 = (long *)((ulong)(uint)((int)plVar38 - (int)plVar35) + (long)plVar30);
      do {
        *plVar30 = *plVar35;
        plVar30 = plVar30 + 1;
        plVar35 = plVar35 + 1;
      } while (plVar30 < plVar12);
      do {
        *(short *)plVar12 = (short)plVar38 - (short)piVar20;
        pcVar31 = (char *)((long)plVar12 + 2);
        puVar39 = (ulong *)((long)plVar38 + 4);
        puVar19 = (ulong *)(piVar20 + 1);
        puVar15 = puVar39;
        if (puVar39 < src + ((ulong)(uint)srcSize - 0xc)) {
          if (*puVar19 == *puVar39) {
            puVar19 = (ulong *)(piVar20 + 3);
            puVar15 = (ulong *)((long)plVar38 + 0xc);
            goto LAB_00119d35;
          }
          uVar5 = *puVar39 ^ *puVar19;
          uVar9 = 0;
          if (uVar5 != 0) {
            for (; (uVar5 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
            }
          }
          uVar9 = uVar9 >> 3 & 0x1fffffff;
          plVar35 = (long *)((long)plVar38 + uVar9 + 4);
LAB_00119dff:
          *dst = *dst + (char)uVar9;
          dst = pcVar31;
        }
        else {
LAB_00119d35:
          if (puVar15 < src + ((ulong)(uint)srcSize - 0xc)) {
            if (*puVar19 == *puVar15) goto code_r0x00119d49;
            uVar5 = *puVar15 ^ *puVar19;
            uVar9 = 0;
            if (uVar5 != 0) {
              for (; (uVar5 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
              }
            }
            puVar15 = (ulong *)((long)puVar15 + (uVar9 >> 3 & 0x1fffffff));
          }
          else {
            if ((puVar15 < src + ((ulong)(uint)srcSize - 8)) && ((int)*puVar19 == (int)*puVar15)) {
              puVar15 = (ulong *)((long)puVar15 + 4);
              puVar19 = (ulong *)((long)puVar19 + 4);
            }
            if ((puVar15 < src + ((ulong)(uint)srcSize - 6)) && ((short)*puVar19 == (short)*puVar15)
               ) {
              puVar15 = (ulong *)((long)puVar15 + 2);
              puVar19 = (ulong *)((long)puVar19 + 2);
            }
            if (puVar15 < src + ((ulong)(uint)srcSize - 5)) {
              puVar15 = (ulong *)((long)puVar15 + (ulong)((char)*puVar19 == (char)*puVar15));
            }
          }
          uVar9 = (long)puVar15 - (long)puVar39;
          uVar23 = (uint)uVar9;
          plVar35 = (long *)((long)plVar38 + (uVar9 & 0xffffffff) + 4);
          if (uVar23 < 0xf) goto LAB_00119dff;
          *dst = *dst + '\x0f';
          uVar4 = uVar23 - 0xf;
          pcVar31[0] = -1;
          pcVar31[1] = -1;
          pcVar31[2] = -1;
          pcVar31[3] = -1;
          if (0x3fb < uVar4) {
            uVar4 = (uVar23 - 0x40b) % 0x3fc;
            uVar9 = (ulong)((uVar23 - 0x40b) / 0x3fc << 2);
            memset((char *)((long)plVar12 + 6),0xff,uVar9 + 4);
            pcVar31 = (char *)((long)plVar12 + uVar9 + 6);
          }
          pcVar31[(ushort)((uVar4 & 0xffff) / 0xff)] = (char)((uVar4 & 0xffff) % 0xff);
          dst = pcVar31 + (ushort)((uVar4 & 0xffff) / 0xff) + 1;
        }
        if (plVar26 <= plVar35) goto LAB_00119edf;
        *(int *)((long)state +
                ((ulong)(*(long *)((long)plVar35 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
             ((int)plVar35 + -2) - iVar11;
        uVar9 = (ulong)(*plVar35 * -0x30e4432345000000) >> 0x34;
        uVar4 = (int)plVar35 - iVar11;
        uVar23 = *(uint *)((long)state + uVar9 * 4);
        *(uint *)((long)state + uVar9 * 4) = uVar4;
        if ((uVar23 + 0xffff < uVar4) ||
           (piVar20 = (int *)((ulong)uVar23 + lVar34), *piVar20 != (int)*plVar35))
        goto LAB_00119ebf;
        plVar12 = (long *)(dst + 1);
        *dst = '\0';
        plVar38 = plVar35;
      } while( true );
    }
    if (iVar22 == 3) {
      uVar23 = *(uint *)((long)state + 0x4000);
      if (srcSize < 0x1000 && uVar23 + srcSize < 0xffff) goto LAB_00119482;
LAB_00119471:
      memset(state,0,0x401c);
    }
    else {
      if (iVar22 != 0) goto LAB_00119471;
      uVar23 = *(uint *)((long)state + 0x4000);
LAB_00119482:
      *(undefined4 *)((long)state + 0x4018) = 0;
      *(undefined8 *)((long)state + 0x4008) = 0;
      *(undefined8 *)((long)state + 0x4010) = 0;
      if (uVar23 != 0) {
        if (0x7e000000 < (uint)srcSize) {
          return 0;
        }
        if (srcSize != 0) {
          *(int *)((long)state + 0x4018) = srcSize;
          *(uint *)((long)state + 0x4000) = uVar23 + srcSize;
          *(undefined4 *)((long)state + 0x4004) = 3;
          piVar20 = (int *)src;
          if (0xc < (uint)srcSize) {
            lVar34 = (long)src - (ulong)uVar23;
            piVar6 = (int *)(src + ((ulong)(uint)srcSize - 0xb));
            *(short *)((long)state + (ulong)((uint)(*(int *)src * -0x61c8864f) >> 0x13) * 2) =
                 (short)uVar23;
            piVar21 = (int *)(src + 2);
            puVar39 = (ulong *)(src + ((ulong)(uint)srcSize - 0xc));
LAB_0011ad38:
            iVar11 = *(int *)((long)piVar20 + 1);
            piVar7 = (int *)((long)piVar20 + 1);
            uVar24 = acceleration;
            uVar4 = acceleration * 0x40;
            while( true ) {
              uVar4 = uVar4 + 1;
              uVar9 = (ulong)((uint)(iVar11 * -0x61c8864f) >> 0x13);
              uVar17 = *(ushort *)((long)state + uVar9 * 2);
              sVar2 = (short)lVar34;
              iVar11 = *piVar21;
              *(short *)((long)state + uVar9 * 2) = (short)piVar7 - sVar2;
              if ((uVar23 <= uVar17) && (*(int *)(lVar34 + (ulong)uVar17) == *piVar7)) break;
              piVar14 = (int *)((ulong)uVar24 + (long)piVar21);
              uVar24 = uVar4 >> 6;
              piVar7 = piVar21;
              piVar21 = piVar14;
              if (piVar6 < piVar14) goto LAB_001194f9;
            }
            lVar13 = (ulong)uVar17 + lVar34;
            iVar11 = (int)piVar7 - (int)piVar20;
            lVar37 = 0;
            cVar3 = (char)piVar7 * '\x10' + (char)piVar20 * -0x10;
            uVar4 = iVar11 - 0xfU;
            do {
              uVar24 = uVar4;
              cVar27 = cVar3;
              lVar29 = lVar37;
              piVar21 = (int *)(lVar13 + lVar29);
              piVar14 = (int *)((long)piVar7 + lVar29);
              if ((piVar21 <= src) || (piVar14 <= piVar20)) break;
              lVar37 = lVar29 + -1;
              cVar3 = cVar27 + -0x10;
              uVar4 = uVar24 - 1;
            } while (*(char *)((long)piVar7 + lVar29 + -1) == *(char *)(lVar13 + -1 + lVar29));
            iVar22 = (int)lVar29;
            psVar28 = (short *)((long)dst + 1);
            if ((uint)(iVar11 + iVar22) < 0xf) {
              *dst = cVar27;
            }
            else {
              uVar9 = (ulong)(iVar11 - 0xfU) + lVar29;
              *dst = -0x10;
              if (0xfe < (int)uVar9) {
                uVar4 = 0x1fd;
                if (uVar24 < 0x1fd) {
                  uVar4 = uVar24;
                }
                if (0x1fc < (int)uVar24) {
                  uVar24 = 0x1fd;
                }
                memset(psVar28,0xff,(ulong)((((iVar11 + 0xef) - uVar4) + iVar22) / 0xff + 1));
                uVar4 = ((iVar11 + 0xef) - uVar24) + iVar22;
                psVar28 = (short *)((long)dst + (ulong)uVar4 / 0xff + 2);
                uVar9 = (ulong)(iVar11 + -0x10e + iVar22 + (uVar4 % 0xff - uVar4));
              }
              *(char *)psVar28 = (char)uVar9;
              psVar28 = (short *)((long)psVar28 + 1);
            }
            psVar16 = (short *)((ulong)(uint)((int)piVar14 - (int)piVar20) + (long)psVar28);
            do {
              *(undefined8 *)psVar28 = *(undefined8 *)piVar20;
              psVar28 = psVar28 + 4;
              piVar20 = piVar20 + 2;
            } while (psVar28 < psVar16);
            do {
              *psVar16 = (short)piVar14 - (short)piVar21;
              psVar28 = psVar16 + 1;
              puVar19 = (ulong *)(piVar14 + 1);
              puVar15 = (ulong *)(piVar21 + 1);
              puVar36 = puVar19;
              if (puVar19 < puVar39) {
                if (*puVar15 == *puVar19) {
                  puVar15 = (ulong *)(piVar21 + 3);
                  puVar36 = (ulong *)(piVar14 + 3);
                  goto LAB_0011af0b;
                }
                uVar5 = *puVar19 ^ *puVar15;
                uVar9 = 0;
                if (uVar5 != 0) {
                  for (; (uVar5 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
                  }
                }
                uVar9 = uVar9 >> 3 & 0x1fffffff;
                piVar20 = (int *)((long)piVar14 + uVar9 + 4);
LAB_0011afec:
                *dst = (char)*(short *)dst + (char)uVar9;
                dst = (char *)psVar28;
              }
              else {
LAB_0011af0b:
                if (puVar36 < puVar39) {
LAB_0011af19:
                  if (*puVar15 == *puVar36) goto code_r0x0011af24;
                  uVar5 = *puVar36 ^ *puVar15;
                  uVar9 = 0;
                  if (uVar5 != 0) {
                    for (; (uVar5 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
                    }
                  }
                  puVar36 = (ulong *)((long)puVar36 + (uVar9 >> 3 & 0x1fffffff));
                  goto LAB_0011af63;
                }
LAB_0011b057:
                if ((puVar36 < src + ((ulong)(uint)srcSize - 8)) && ((int)*puVar15 == (int)*puVar36)
                   ) {
                  puVar36 = (ulong *)((long)puVar36 + 4);
                  puVar15 = (ulong *)((long)puVar15 + 4);
                }
                if ((puVar36 < src + ((ulong)(uint)srcSize - 6)) &&
                   ((short)*puVar15 == (short)*puVar36)) {
                  puVar36 = (ulong *)((long)puVar36 + 2);
                  puVar15 = (ulong *)((long)puVar15 + 2);
                }
                if (puVar36 < src + ((ulong)(uint)srcSize - 5)) {
                  puVar36 = (ulong *)((long)puVar36 + (ulong)((char)*puVar15 == (char)*puVar36));
                }
LAB_0011af63:
                uVar9 = (long)puVar36 - (long)puVar19;
                uVar4 = (uint)uVar9;
                piVar20 = (int *)((long)piVar14 + (uVar9 & 0xffffffff) + 4);
                if (uVar4 < 0xf) goto LAB_0011afec;
                *dst = (char)*(short *)dst + '\x0f';
                uVar24 = uVar4 - 0xf;
                psVar28[0] = -1;
                psVar28[1] = -1;
                if (0x3fb < uVar24) {
                  uVar24 = (uVar4 - 0x40b) % 0x3fc;
                  uVar9 = (ulong)((uVar4 - 0x40b) / 0x3fc << 2);
                  memset(psVar16 + 3,0xff,uVar9 + 4);
                  psVar28 = (short *)((long)psVar16 + uVar9 + 6);
                }
                pcVar31 = (char *)((long)psVar28 + (ulong)(ushort)((uVar24 & 0xffff) / 0xff));
                *pcVar31 = (char)((uVar24 & 0xffff) % 0xff);
                dst = pcVar31 + 1;
              }
              if (piVar6 <= piVar20) break;
              *(short *)((long)state +
                        (ulong)((uint)(*(int *)((long)piVar20 + -2) * -0x61c8864f) >> 0x13) * 2) =
                   ((short)piVar20 + -2) - sVar2;
              uVar9 = (ulong)((uint)(*piVar20 * -0x61c8864f) >> 0x13);
              uVar17 = *(ushort *)((long)state + uVar9 * 2);
              *(short *)((long)state + uVar9 * 2) = (short)piVar20 - sVar2;
              if ((uVar17 < uVar23) ||
                 (piVar21 = (int *)((ulong)uVar17 + lVar34), *piVar21 != *piVar20))
              goto LAB_0011b0b6;
              psVar16 = (short *)((long)dst + 1);
              *dst = '\0';
              piVar14 = piVar20;
            } while( true );
          }
LAB_001194f9:
          pcVar31 = src + ((ulong)(uint)srcSize - (long)piVar20);
          if (pcVar31 < (char *)0xf) {
            *dst = (char)pcVar31 << 4;
          }
          else {
            pcVar8 = pcVar31 + -0xf;
            *dst = -0x10;
            psVar28 = (short *)((long)dst + 1);
            if ((char *)0xfe < pcVar8) {
              uVar9 = (ulong)(pcVar31 + -0x10e) / 0xff;
              memset(psVar28,0xff,uVar9 + 1);
              pcVar8 = pcVar31 + uVar9 * -0xff + -0x10e;
              psVar28 = (short *)((long)dst + uVar9 + 2);
            }
            *(char *)psVar28 = (char)pcVar8;
            dst = (char *)psVar28;
          }
          memcpy((char *)((long)dst + 1),piVar20,(size_t)pcVar31);
          iVar11 = (int)(char *)((long)dst + 1) + (int)pcVar31;
          goto LAB_0011b0f2;
        }
        goto LAB_001195c6;
      }
    }
    if (0x7e000000 < (uint)srcSize) {
      return 0;
    }
    if (srcSize != 0) {
      *(int *)((long)state + 0x4018) = srcSize;
      *(int *)((long)state + 0x4000) = srcSize;
      *(undefined4 *)((long)state + 0x4004) = 3;
      if (0xc < (uint)srcSize) {
        *(undefined2 *)((long)state + (ulong)((uint)(*(int *)src * -0x61c8864f) >> 0x13) * 2) = 0;
LAB_0011a3f7:
        uVar9 = 1;
        iVar11 = *(int *)((long)local_b8 + 1);
        piVar20 = (int *)((long)local_b8 + 1);
        uVar23 = acceleration << 6;
        do {
          piVar21 = piVar20;
          piVar20 = (int *)(uVar9 + (long)piVar21);
          if (src + ((ulong)(uint)srcSize - 0xb) < piVar20) goto LAB_0011a722;
          uVar9 = (ulong)(uVar23 >> 6);
          uVar23 = uVar23 + 1;
          uVar32 = (ulong)((uint)(iVar11 * -0x61c8864f) >> 0x13);
          uVar5 = (ulong)*(ushort *)((long)state + uVar32 * 2);
          iVar11 = *piVar20;
          *(short *)((long)state + uVar32 * 2) = (short)piVar21 - sVar2;
        } while (*(int *)(src + uVar5) != *piVar21);
        iVar11 = (int)piVar21 - (int)local_b8;
        lVar34 = 0;
        cVar3 = (char)piVar21 * '\x10' + (char)local_b8 * -0x10;
        uVar23 = iVar11 - 0xfU;
        do {
          uVar4 = uVar23;
          cVar27 = cVar3;
          lVar37 = lVar34;
          pcVar31 = src + lVar37 + uVar5;
          piVar20 = (int *)((long)piVar21 + lVar37);
          if ((pcVar31 <= src) || (piVar20 <= local_b8)) break;
          lVar34 = lVar37 + -1;
          cVar3 = cVar27 + -0x10;
          uVar23 = uVar4 - 1;
        } while (*(char *)((long)piVar21 + lVar37 + -1) == src[lVar37 + (uVar5 - 1)]);
        iVar22 = (int)lVar37;
        psVar28 = (short *)((long)dst + 1);
        if ((uint)(iVar11 + iVar22) < 0xf) {
          *dst = cVar27;
        }
        else {
          uVar9 = (ulong)(iVar11 - 0xfU) + lVar37;
          *dst = -0x10;
          if (0xfe < (int)uVar9) {
            uVar23 = 0x1fd;
            if (uVar4 < 0x1fd) {
              uVar23 = uVar4;
            }
            if (0x1fc < (int)uVar4) {
              uVar4 = 0x1fd;
            }
            memset(psVar28,0xff,(ulong)((((iVar11 + 0xef) - uVar23) + iVar22) / 0xff + 1));
            uVar23 = ((iVar11 + 0xef) - uVar4) + iVar22;
            psVar28 = (short *)((long)dst + (ulong)uVar23 / 0xff + 2);
            uVar9 = (ulong)(iVar11 + -0x10e + iVar22 + (uVar23 % 0xff - uVar23));
          }
          *(char *)psVar28 = (char)uVar9;
          psVar28 = (short *)((long)psVar28 + 1);
        }
        psVar16 = (short *)((ulong)(uint)((int)piVar20 - (int)local_b8) + (long)psVar28);
        do {
          *(undefined8 *)psVar28 = *(undefined8 *)local_b8;
          psVar28 = psVar28 + 4;
          local_b8 = local_b8 + 2;
        } while (psVar28 < psVar16);
        do {
          *psVar16 = (short)piVar20 - (short)pcVar31;
          psVar28 = psVar16 + 1;
          puVar39 = (ulong *)(piVar20 + 1);
          puVar19 = (ulong *)(pcVar31 + 4);
          puVar15 = puVar39;
          if (puVar39 < src + ((ulong)(uint)srcSize - 0xc)) {
            if (*puVar19 == *puVar39) {
              puVar19 = (ulong *)(pcVar31 + 0xc);
              puVar15 = (ulong *)(piVar20 + 3);
              goto LAB_0011a602;
            }
            uVar5 = *puVar39 ^ *puVar19;
            uVar9 = 0;
            if (uVar5 != 0) {
              for (; (uVar5 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
              }
            }
            uVar9 = uVar9 >> 3 & 0x1fffffff;
            local_b8 = (int *)((long)piVar20 + uVar9 + 4);
LAB_0011a6b0:
            *dst = (char)*(short *)dst + (char)uVar9;
            dst = (char *)psVar28;
          }
          else {
LAB_0011a602:
            if (puVar15 < src + ((ulong)(uint)srcSize - 0xc)) {
              if (*puVar19 == *puVar15) goto code_r0x0011a616;
              uVar5 = *puVar15 ^ *puVar19;
              uVar9 = 0;
              if (uVar5 != 0) {
                for (; (uVar5 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
                }
              }
              puVar15 = (ulong *)((long)puVar15 + (uVar9 >> 3 & 0x1fffffff));
            }
            else {
              if ((puVar15 < src + ((ulong)(uint)srcSize - 8)) && ((int)*puVar19 == (int)*puVar15))
              {
                puVar15 = (ulong *)((long)puVar15 + 4);
                puVar19 = (ulong *)((long)puVar19 + 4);
              }
              if ((puVar15 < src + ((ulong)(uint)srcSize - 6)) &&
                 ((short)*puVar19 == (short)*puVar15)) {
                puVar15 = (ulong *)((long)puVar15 + 2);
                puVar19 = (ulong *)((long)puVar19 + 2);
              }
              if (puVar15 < src + ((ulong)(uint)srcSize - 5)) {
                puVar15 = (ulong *)((long)puVar15 + (ulong)((char)*puVar19 == (char)*puVar15));
              }
            }
            uVar9 = (long)puVar15 - (long)puVar39;
            uVar23 = (uint)uVar9;
            local_b8 = (int *)((long)piVar20 + (uVar9 & 0xffffffff) + 4);
            if (uVar23 < 0xf) goto LAB_0011a6b0;
            *dst = (char)*(short *)dst + '\x0f';
            uVar4 = uVar23 - 0xf;
            psVar28[0] = -1;
            psVar28[1] = -1;
            if (0x3fb < uVar4) {
              uVar4 = (uVar23 - 0x40b) % 0x3fc;
              uVar9 = (ulong)((uVar23 - 0x40b) / 0x3fc << 2);
              memset(psVar16 + 3,0xff,uVar9 + 4);
              psVar28 = (short *)((long)psVar16 + uVar9 + 6);
            }
            pcVar31 = (char *)((long)psVar28 + (ulong)(ushort)((uVar4 & 0xffff) / 0xff));
            *pcVar31 = (char)((uVar4 & 0xffff) % 0xff);
            dst = pcVar31 + 1;
          }
          if (src + ((ulong)(uint)srcSize - 0xb) <= local_b8) break;
          *(short *)((long)state +
                    (ulong)((uint)(*(int *)((long)local_b8 + -2) * -0x61c8864f) >> 0x13) * 2) =
               ((short)local_b8 + -2) - sVar2;
          uVar9 = (ulong)((uint)(*local_b8 * -0x61c8864f) >> 0x13);
          uVar17 = *(ushort *)((long)state + uVar9 * 2);
          pcVar31 = src + uVar17;
          *(short *)((long)state + uVar9 * 2) = (short)local_b8 - sVar2;
          if (*(int *)(src + uVar17) != *local_b8) goto LAB_0011a3f7;
          psVar16 = (short *)((long)dst + 1);
          *dst = '\0';
          piVar20 = local_b8;
        } while( true );
      }
LAB_0011a722:
      pcVar31 = src + ((ulong)(uint)srcSize - (long)local_b8);
      if (pcVar31 < (char *)0xf) {
        *dst = (char)pcVar31 << 4;
      }
      else {
        pcVar8 = pcVar31 + -0xf;
        *dst = -0x10;
        psVar28 = (short *)((long)dst + 1);
        if ((char *)0xfe < pcVar8) {
          uVar9 = (ulong)(pcVar31 + -0x10e) / 0xff;
          memset(psVar28,0xff,uVar9 + 1);
          pcVar8 = pcVar31 + uVar9 * -0xff + -0x10e;
          psVar28 = (short *)((long)dst + uVar9 + 2);
        }
        *(char *)psVar28 = (char)pcVar8;
        dst = (char *)psVar28;
      }
      memcpy((char *)((long)dst + 1),local_b8,(size_t)pcVar31);
      iVar11 = (int)(char *)((long)dst + 1) + (int)pcVar31;
LAB_0011b0f2:
      return iVar11 - iVar18;
    }
LAB_001195c6:
    *dst = '\0';
    return 1;
  }
  pcVar31 = dst;
  plVar38 = (long *)src;
  if (0x1000a < srcSize) {
    if (iVar22 == 0) {
      if (*(int *)((long)state + 0x4000) == 0) {
        uVar23 = 0;
      }
      else {
        uVar23 = *(int *)((long)state + 0x4000) + 0x10000;
        *(uint *)((long)state + 0x4000) = uVar23;
      }
    }
    else {
      uVar23 = 0;
      memset(state,0,0x4008);
    }
    *(undefined4 *)((long)state + 0x4018) = 0;
    *(undefined8 *)((long)state + 0x4008) = 0;
    *(undefined8 *)((long)state + 0x4010) = 0;
    if (0x7e000000 < (uint)srcSize) {
      return 0;
    }
    lVar34 = (long)src - (ulong)uVar23;
    plVar26 = (long *)(src + ((ulong)(uint)srcSize - 0xb));
    *(int *)((long)state + 0x4018) = srcSize;
    *(uint *)((long)state + 0x4000) = srcSize + uVar23;
    *(undefined4 *)((long)state + 0x4004) = 2;
    *(uint *)((long)state + ((ulong)(*(long *)src * -0x30e4432345000000) >> 0x34) * 4) = uVar23;
    plVar35 = (long *)(src + 2);
    puVar39 = (ulong *)(src + ((ulong)(uint)srcSize - 0xc));
LAB_001196af:
    lVar37 = *(long *)((long)plVar38 + 1);
    plVar30 = (long *)((long)plVar38 + 1);
    uVar4 = acceleration;
    uVar23 = acceleration * 0x40;
    while( true ) {
      uVar23 = uVar23 + 1;
      uVar9 = (ulong)(lVar37 * -0x30e4432345000000) >> 0x34;
      uVar24 = *(uint *)((long)state + uVar9 * 4);
      iVar11 = (int)plVar30;
      iVar22 = (int)lVar34;
      lVar37 = *plVar35;
      *(int *)((long)state + uVar9 * 4) = iVar11 - iVar22;
      if (((uint)(iVar11 - iVar22) <= uVar24 + 0xffff) &&
         (*(int *)(lVar34 + (ulong)uVar24) == (int)*plVar30)) break;
      plVar12 = (long *)((ulong)uVar4 + (long)plVar35);
      uVar4 = uVar23 >> 6;
      plVar30 = plVar35;
      plVar35 = plVar12;
      if (plVar26 < plVar12) goto LAB_0011b113;
    }
    lVar13 = (ulong)uVar24 + lVar34;
    uVar4 = iVar11 - (int)plVar38;
    lVar37 = 0;
    uVar23 = uVar4 - 0xf;
    cVar3 = (char)plVar30 * '\x10' + (char)plVar38 * -0x10;
    do {
      cVar27 = cVar3;
      uVar24 = uVar23;
      lVar29 = lVar37;
      piVar20 = (int *)(lVar13 + lVar29);
      plVar35 = (long *)((long)plVar30 + lVar29);
      if ((piVar20 <= src) || (plVar35 <= plVar38)) break;
      lVar37 = lVar29 + -1;
      uVar23 = uVar24 - 1;
      cVar3 = cVar27 + -0x10;
    } while (*(char *)((long)plVar30 + lVar29 + -1) == *(char *)(lVar13 + -1 + lVar29));
    iVar1 = (int)lVar29;
    uVar9 = (ulong)(uint)(iVar1 + (iVar11 - (int)plVar38));
    if (dst + dstCapacity < pcVar31 + ((ulong)uVar4 + lVar29 & 0xffffffff) / 0xff + uVar9 + 9) {
      return 0;
    }
    plVar30 = (long *)(pcVar31 + 1);
    if ((uint)((ulong)uVar4 + lVar29) < 0xf) {
      *pcVar31 = cVar27;
    }
    else {
      uVar5 = (ulong)(uVar4 - 0xf) + lVar29;
      *pcVar31 = -0x10;
      if (0xfe < (int)uVar5) {
        uVar23 = 0x1fd;
        if (uVar24 < 0x1fd) {
          uVar23 = uVar24;
        }
        if (0x1fc < (int)uVar24) {
          uVar24 = 0x1fd;
        }
        memset(plVar30,0xff,(ulong)((((uVar4 + 0xef) - uVar23) + iVar1) / 0xff + 1));
        uVar23 = ((uVar4 + 0xef) - uVar24) + iVar1;
        plVar30 = (long *)(pcVar31 + (ulong)uVar23 / 0xff + 2);
        uVar5 = (ulong)((uVar4 - 0x10e) + iVar1 + (uVar23 % 0xff - uVar23));
      }
      *(char *)plVar30 = (char)uVar5;
      plVar30 = (long *)((long)plVar30 + 1);
    }
    plVar12 = (long *)(uVar9 + (long)plVar30);
    do {
      *plVar30 = *plVar38;
      plVar30 = plVar30 + 1;
      plVar38 = plVar38 + 1;
    } while (plVar30 < plVar12);
    do {
      *(short *)plVar12 = (short)plVar35 - (short)piVar20;
      puVar19 = (ulong *)((long)plVar35 + 4);
      puVar15 = (ulong *)(piVar20 + 1);
      puVar36 = puVar19;
      if (puVar19 < puVar39) {
        if (*puVar15 == *puVar19) {
          puVar15 = (ulong *)(piVar20 + 3);
          puVar36 = (ulong *)((long)plVar35 + 0xc);
          goto LAB_001198a3;
        }
        uVar9 = *puVar19 ^ *puVar15;
        lVar37 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
          }
        }
        uVar23 = (uint)lVar37 >> 3;
      }
      else {
LAB_001198a3:
        if (puVar36 < puVar39) {
          iVar11 = ((int)puVar36 - (int)plVar35) + -4;
LAB_001198b1:
          if (*puVar15 == *puVar36) goto code_r0x001198bd;
          uVar5 = *puVar36 ^ *puVar15;
          uVar9 = 0;
          if (uVar5 != 0) {
            for (; (uVar5 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
            }
          }
          uVar23 = ((uint)(uVar9 >> 3) & 0x1fffffff) + iVar11;
          goto LAB_00119936;
        }
LAB_001198cd:
        if ((puVar36 < src + ((ulong)(uint)srcSize - 8)) && ((int)*puVar15 == (int)*puVar36)) {
          puVar36 = (ulong *)((long)puVar36 + 4);
          puVar15 = (ulong *)((long)puVar15 + 4);
        }
        if ((puVar36 < src + ((ulong)(uint)srcSize - 6)) && ((short)*puVar15 == (short)*puVar36)) {
          puVar36 = (ulong *)((long)puVar36 + 2);
          puVar15 = (ulong *)((long)puVar15 + 2);
        }
        if (puVar36 < src + ((ulong)(uint)srcSize - 5)) {
          puVar36 = (ulong *)((long)puVar36 + (ulong)((char)*puVar15 == (char)*puVar36));
        }
        uVar23 = (int)puVar36 - (int)puVar19;
      }
LAB_00119936:
      if (dst + dstCapacity < (char *)((long)plVar12 + (ulong)(uVar23 + 0xf0) / 0xff + 8)) {
        return 0;
      }
      pcVar8 = (char *)((long)plVar12 + 2);
      if (uVar23 < 0xf) {
        *pcVar31 = *pcVar31 + (char)uVar23;
        pcVar31 = pcVar8;
      }
      else {
        *pcVar31 = *pcVar31 + '\x0f';
        uVar17 = (ushort)(uVar23 - 0xf);
        pcVar8[0] = -1;
        pcVar8[1] = -1;
        pcVar8[2] = -1;
        pcVar8[3] = -1;
        if (0x3fb < uVar23 - 0xf) {
          uVar17 = (ushort)((ulong)(uVar23 - 0x40b) % 0x3fc);
          uVar9 = (ulong)((uVar23 - 0x40b) / 0x3fc << 2);
          memset((char *)((long)plVar12 + 6),0xff,uVar9 + 4);
          pcVar8 = (char *)((long)plVar12 + uVar9 + 6);
        }
        pcVar8[uVar17 / 0xff] = (char)(uVar17 % 0xff);
        pcVar31 = pcVar8 + uVar17 / 0xff + 1;
      }
      lVar37 = (long)plVar35 + (ulong)uVar23;
      plVar38 = (long *)(lVar37 + 4);
      if (plVar26 <= plVar38) goto LAB_0011b113;
      *(int *)((long)state + ((ulong)(*(long *)(lVar37 + 2) * -0x30e4432345000000) >> 0x34) * 4) =
           ((int)lVar37 + 2) - iVar22;
      uVar9 = (ulong)(*plVar38 * -0x30e4432345000000) >> 0x34;
      uVar4 = (int)plVar38 - iVar22;
      uVar23 = *(uint *)((long)state + uVar9 * 4);
      *(uint *)((long)state + uVar9 * 4) = uVar4;
      if ((uVar23 + 0xffff < uVar4) ||
         (piVar20 = (int *)((ulong)uVar23 + lVar34), *piVar20 != *(int *)plVar38))
      goto LAB_00119a6a;
      plVar12 = (long *)(pcVar31 + 1);
      *pcVar31 = '\0';
      plVar35 = plVar38;
    } while( true );
  }
  if (iVar22 == 3) {
    uVar23 = *(uint *)((long)state + 0x4000);
    if (srcSize < 0x1000 && srcSize + uVar23 < 0xffff) goto LAB_00119374;
LAB_00119360:
    memset(state,0,0x401c);
  }
  else {
    if (iVar22 != 0) goto LAB_00119360;
    uVar23 = *(uint *)((long)state + 0x4000);
LAB_00119374:
    *(undefined4 *)((long)state + 0x4018) = 0;
    *(undefined8 *)((long)state + 0x4008) = 0;
    *(undefined8 *)((long)state + 0x4010) = 0;
    if (uVar23 != 0) {
      if (0x7e000000 < (uint)srcSize) {
        return 0;
      }
      if (srcSize != 0) {
        *(int *)((long)state + 0x4018) = srcSize;
        *(uint *)((long)state + 0x4000) = srcSize + uVar23;
        *(undefined4 *)((long)state + 0x4004) = 3;
        if ((uint)srcSize < 0xd) {
LAB_0011b113:
          pcVar8 = src + ((ulong)(uint)srcSize - (long)plVar38);
          if (pcVar31 + (long)(pcVar8 + (ulong)(pcVar8 + 0xf0) / 0xff + 1) <= dst + dstCapacity) {
            if (pcVar8 < (char *)0xf) {
              *pcVar31 = (char)pcVar8 << 4;
            }
            else {
              pcVar10 = pcVar8 + -0xf;
              *pcVar31 = -0x10;
              __s = pcVar31 + 1;
              if ((char *)0xfe < pcVar10) {
                uVar9 = (ulong)(pcVar8 + -0x10e) / 0xff;
                memset(__s,0xff,uVar9 + 1);
                pcVar10 = pcVar8 + uVar9 * -0xff + -0x10e;
                __s = pcVar31 + uVar9 + 2;
              }
              *__s = (char)pcVar10;
              pcVar31 = __s;
            }
            memcpy(pcVar31 + 1,plVar38,(size_t)pcVar8);
            return ((int)(pcVar31 + 1) + (int)pcVar8) - iVar18;
          }
          return 0;
        }
        lVar34 = (long)src - (ulong)uVar23;
        plVar26 = (long *)(src + ((ulong)(uint)srcSize - 0xb));
        *(short *)((long)state + (ulong)((uint)(*(int *)src * -0x61c8864f) >> 0x13) * 2) =
             (short)uVar23;
        plVar35 = (long *)(src + 2);
        puVar39 = (ulong *)(src + ((ulong)(uint)srcSize - 0xc));
LAB_0011a8fc:
        iVar11 = *(int *)((long)plVar38 + 1);
        plVar30 = (long *)((long)plVar38 + 1);
        uVar24 = acceleration;
        uVar4 = acceleration * 0x40;
        while( true ) {
          uVar4 = uVar4 + 1;
          uVar9 = (ulong)((uint)(iVar11 * -0x61c8864f) >> 0x13);
          uVar17 = *(ushort *)((long)state + uVar9 * 2);
          sVar2 = (short)lVar34;
          iVar11 = (int)*plVar35;
          *(short *)((long)state + uVar9 * 2) = (short)plVar30 - sVar2;
          if ((uVar23 <= uVar17) && (*(int *)(lVar34 + (ulong)uVar17) == (int)*plVar30)) break;
          plVar12 = (long *)((ulong)uVar24 + (long)plVar35);
          uVar24 = uVar4 >> 6;
          plVar30 = plVar35;
          plVar35 = plVar12;
          if (plVar26 < plVar12) goto LAB_0011b113;
        }
        lVar13 = (ulong)uVar17 + lVar34;
        uVar24 = (int)plVar30 - (int)plVar38;
        lVar37 = 0;
        uVar4 = uVar24 - 0xf;
        cVar3 = (char)plVar30 * '\x10' + (char)plVar38 * -0x10;
        do {
          cVar27 = cVar3;
          uVar33 = uVar4;
          lVar29 = lVar37;
          piVar20 = (int *)(lVar13 + lVar29);
          plVar35 = (long *)((long)plVar30 + lVar29);
          if ((piVar20 <= src) || (plVar35 <= plVar38)) break;
          lVar37 = lVar29 + -1;
          uVar4 = uVar33 - 1;
          cVar3 = cVar27 + -0x10;
        } while (*(char *)((long)plVar30 + lVar29 + -1) == *(char *)(lVar13 + -1 + lVar29));
        iVar11 = (int)lVar29;
        uVar9 = (ulong)(uint)(iVar11 + ((int)plVar30 - (int)plVar38));
        if (dst + dstCapacity < pcVar31 + ((ulong)uVar24 + lVar29 & 0xffffffff) / 0xff + uVar9 + 9)
        {
          return 0;
        }
        plVar30 = (long *)(pcVar31 + 1);
        if ((uint)((ulong)uVar24 + lVar29) < 0xf) {
          *pcVar31 = cVar27;
        }
        else {
          uVar5 = (ulong)(uVar24 - 0xf) + lVar29;
          *pcVar31 = -0x10;
          if (0xfe < (int)uVar5) {
            uVar4 = 0x1fd;
            if (uVar33 < 0x1fd) {
              uVar4 = uVar33;
            }
            if (0x1fc < (int)uVar33) {
              uVar33 = 0x1fd;
            }
            memset(plVar30,0xff,(ulong)((((uVar24 + 0xef) - uVar4) + iVar11) / 0xff + 1));
            uVar4 = ((uVar24 + 0xef) - uVar33) + iVar11;
            plVar30 = (long *)(pcVar31 + (ulong)uVar4 / 0xff + 2);
            uVar5 = (ulong)((uVar24 - 0x10e) + iVar11 + (uVar4 % 0xff - uVar4));
          }
          *(char *)plVar30 = (char)uVar5;
          plVar30 = (long *)((long)plVar30 + 1);
        }
        plVar12 = (long *)(uVar9 + (long)plVar30);
        do {
          *plVar30 = *plVar38;
          plVar30 = plVar30 + 1;
          plVar38 = plVar38 + 1;
        } while (plVar30 < plVar12);
        do {
          *(short *)plVar12 = (short)plVar35 - (short)piVar20;
          puVar19 = (ulong *)((long)plVar35 + 4);
          puVar15 = (ulong *)(piVar20 + 1);
          puVar36 = puVar19;
          if (puVar19 < puVar39) {
            if (*puVar15 == *puVar19) {
              puVar15 = (ulong *)(piVar20 + 3);
              puVar36 = (ulong *)((long)plVar35 + 0xc);
              goto LAB_0011aaef;
            }
            uVar9 = *puVar19 ^ *puVar15;
            lVar37 = 0;
            if (uVar9 != 0) {
              for (; (uVar9 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
              }
            }
            uVar4 = (uint)lVar37 >> 3;
          }
          else {
LAB_0011aaef:
            if (puVar36 < puVar39) {
              iVar11 = ((int)puVar36 - (int)plVar35) + -4;
LAB_0011aafd:
              if (*puVar15 == *puVar36) goto code_r0x0011ab09;
              uVar5 = *puVar36 ^ *puVar15;
              uVar9 = 0;
              if (uVar5 != 0) {
                for (; (uVar5 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
                }
              }
              uVar4 = ((uint)(uVar9 >> 3) & 0x1fffffff) + iVar11;
              goto LAB_0011ab82;
            }
LAB_0011ab19:
            if ((puVar36 < src + ((ulong)(uint)srcSize - 8)) && ((int)*puVar15 == (int)*puVar36)) {
              puVar36 = (ulong *)((long)puVar36 + 4);
              puVar15 = (ulong *)((long)puVar15 + 4);
            }
            if ((puVar36 < src + ((ulong)(uint)srcSize - 6)) && ((short)*puVar15 == (short)*puVar36)
               ) {
              puVar36 = (ulong *)((long)puVar36 + 2);
              puVar15 = (ulong *)((long)puVar15 + 2);
            }
            if (puVar36 < src + ((ulong)(uint)srcSize - 5)) {
              puVar36 = (ulong *)((long)puVar36 + (ulong)((char)*puVar15 == (char)*puVar36));
            }
            uVar4 = (int)puVar36 - (int)puVar19;
          }
LAB_0011ab82:
          if (dst + dstCapacity < (char *)((long)plVar12 + (ulong)(uVar4 + 0xf0) / 0xff + 8)) {
            return 0;
          }
          pcVar8 = (char *)((long)plVar12 + 2);
          if (uVar4 < 0xf) {
            *pcVar31 = *pcVar31 + (char)uVar4;
            pcVar31 = pcVar8;
          }
          else {
            *pcVar31 = *pcVar31 + '\x0f';
            uVar17 = (ushort)(uVar4 - 0xf);
            pcVar8[0] = -1;
            pcVar8[1] = -1;
            pcVar8[2] = -1;
            pcVar8[3] = -1;
            if (0x3fb < uVar4 - 0xf) {
              uVar17 = (ushort)((ulong)(uVar4 - 0x40b) % 0x3fc);
              uVar9 = (ulong)((uVar4 - 0x40b) / 0x3fc << 2);
              memset((char *)((long)plVar12 + 6),0xff,uVar9 + 4);
              pcVar8 = (char *)((long)plVar12 + uVar9 + 6);
            }
            pcVar8[uVar17 / 0xff] = (char)(uVar17 % 0xff);
            pcVar31 = pcVar8 + uVar17 / 0xff + 1;
          }
          lVar37 = (long)plVar35 + (ulong)uVar4;
          plVar38 = (long *)(lVar37 + 4);
          if (plVar26 <= plVar38) goto LAB_0011b113;
          *(short *)((long)state + (ulong)((uint)(*(int *)(lVar37 + 2) * -0x61c8864f) >> 0x13) * 2)
               = ((short)lVar37 + 2) - sVar2;
          uVar9 = (ulong)((uint)(*(int *)plVar38 * -0x61c8864f) >> 0x13);
          uVar17 = *(ushort *)((long)state + uVar9 * 2);
          *(short *)((long)state + uVar9 * 2) = (short)plVar38 - sVar2;
          if ((uVar17 < uVar23) ||
             (piVar20 = (int *)((ulong)uVar17 + lVar34), *piVar20 != *(int *)plVar38))
          goto LAB_0011acad;
          plVar12 = (long *)(pcVar31 + 1);
          *pcVar31 = '\0';
          plVar35 = plVar38;
        } while( true );
      }
      goto LAB_001195b3;
    }
  }
  if (0x7e000000 < (uint)srcSize) {
    return 0;
  }
  if (srcSize != 0) {
    pcVar31 = dst + dstCapacity;
    *(int *)((long)state + 0x4018) = srcSize;
    *(int *)((long)state + 0x4000) = srcSize;
    *(undefined4 *)((long)state + 0x4004) = 3;
    local_b0 = (short *)dst;
    if ((uint)srcSize < 0xd) {
LAB_0011a7c0:
      pcVar8 = src + ((ulong)(uint)srcSize - (long)local_b8);
      if ((char *)((long)local_b0 + (long)(pcVar8 + (ulong)(pcVar8 + 0xf0) / 0xff + 1)) <= pcVar31)
      {
        if (pcVar8 < (char *)0xf) {
          *(char *)local_b0 = (char)pcVar8 << 4;
        }
        else {
          pcVar31 = pcVar8 + -0xf;
          *(char *)local_b0 = -0x10;
          psVar28 = (short *)((long)local_b0 + 1);
          if ((char *)0xfe < pcVar31) {
            uVar9 = (ulong)(pcVar8 + -0x10e) / 0xff;
            memset((short *)((long)local_b0 + 1),0xff,uVar9 + 1);
            pcVar31 = pcVar8 + uVar9 * -0xff + -0x10e;
            psVar28 = (short *)((long)local_b0 + uVar9 + 2);
          }
          local_b0 = psVar28;
          *(char *)local_b0 = (char)pcVar31;
        }
        memcpy((char *)((long)local_b0 + 1),local_b8,(size_t)pcVar8);
        return ((int)(char *)((long)local_b0 + 1) + (int)pcVar8) - iVar18;
      }
      return 0;
    }
    *(undefined2 *)((long)state + (ulong)((uint)(*(int *)src * -0x61c8864f) >> 0x13) * 2) = 0;
    puVar39 = (ulong *)(src + ((ulong)(uint)srcSize - 0xc));
LAB_00119fd7:
    uVar9 = 1;
    iVar11 = *(int *)((long)local_b8 + 1);
    piVar20 = (int *)((long)local_b8 + 1);
    uVar23 = acceleration << 6;
    do {
      piVar21 = piVar20;
      piVar20 = (int *)(uVar9 + (long)piVar21);
      if (src + ((ulong)(uint)srcSize - 0xb) < piVar20) goto LAB_0011a7c0;
      uVar9 = (ulong)(uVar23 >> 6);
      uVar23 = uVar23 + 1;
      uVar32 = (ulong)((uint)(iVar11 * -0x61c8864f) >> 0x13);
      uVar5 = (ulong)*(ushort *)((long)state + uVar32 * 2);
      iVar11 = *piVar20;
      *(short *)((long)state + uVar32 * 2) = (short)piVar21 - sVar2;
    } while (*(int *)(src + uVar5) != *piVar21);
    uVar4 = (int)piVar21 - (int)local_b8;
    lVar34 = 0;
    uVar23 = uVar4 - 0xf;
    cVar3 = (char)piVar21 * '\x10' + (char)local_b8 * -0x10;
    do {
      cVar27 = cVar3;
      uVar24 = uVar23;
      lVar37 = lVar34;
      pcVar8 = src + lVar37 + uVar5;
      piVar20 = (int *)((long)piVar21 + lVar37);
      if ((pcVar8 <= src) || (piVar20 <= local_b8)) break;
      lVar34 = lVar37 + -1;
      uVar23 = uVar24 - 1;
      cVar3 = cVar27 + -0x10;
    } while (*(char *)((long)piVar21 + lVar37 + -1) == src[lVar37 + (uVar5 - 1)]);
    iVar11 = (int)lVar37;
    uVar9 = (ulong)(uint)(iVar11 + ((int)piVar21 - (int)local_b8));
    if (pcVar31 < (char *)((long)local_b0 + ((ulong)uVar4 + lVar37 & 0xffffffff) / 0xff + uVar9 + 9)
       ) {
      return 0;
    }
    psVar28 = (short *)((long)local_b0 + 1);
    if ((uint)((ulong)uVar4 + lVar37) < 0xf) {
      *(char *)local_b0 = cVar27;
    }
    else {
      uVar5 = (ulong)(uVar4 - 0xf) + lVar37;
      *(char *)local_b0 = -0x10;
      if (0xfe < (int)uVar5) {
        uVar23 = 0x1fd;
        if (uVar24 < 0x1fd) {
          uVar23 = uVar24;
        }
        if (0x1fc < (int)uVar24) {
          uVar24 = 0x1fd;
        }
        memset(psVar28,0xff,(ulong)((((uVar4 + 0xef) - uVar23) + iVar11) / 0xff + 1));
        uVar23 = ((uVar4 + 0xef) - uVar24) + iVar11;
        psVar28 = (short *)((long)local_b0 + (ulong)uVar23 / 0xff + 2);
        uVar5 = (ulong)((uVar4 - 0x10e) + iVar11 + (uVar23 % 0xff - uVar23));
      }
      *(char *)psVar28 = (char)uVar5;
      psVar28 = (short *)((long)psVar28 + 1);
    }
    psVar16 = (short *)(uVar9 + (long)psVar28);
    do {
      *(undefined8 *)psVar28 = *(undefined8 *)local_b8;
      psVar28 = psVar28 + 4;
      local_b8 = local_b8 + 2;
      psVar25 = local_b0;
    } while (psVar28 < psVar16);
    do {
      *psVar16 = (short)piVar20 - (short)pcVar8;
      puVar19 = (ulong *)(piVar20 + 1);
      puVar15 = (ulong *)(pcVar8 + 4);
      puVar36 = puVar19;
      if (puVar19 < puVar39) {
        if (*puVar15 == *puVar19) {
          puVar15 = (ulong *)(pcVar8 + 0xc);
          puVar36 = (ulong *)(piVar20 + 3);
          goto LAB_0011a1c8;
        }
        uVar9 = *puVar19 ^ *puVar15;
        lVar34 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
          }
        }
        uVar23 = (uint)lVar34 >> 3;
      }
      else {
LAB_0011a1c8:
        if (puVar36 < puVar39) {
          iVar11 = ((int)puVar36 - (int)piVar20) + -4;
LAB_0011a1d9:
          if (*puVar15 == *puVar36) goto code_r0x0011a1e5;
          uVar5 = *puVar36 ^ *puVar15;
          uVar9 = 0;
          if (uVar5 != 0) {
            for (; (uVar5 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
            }
          }
          uVar23 = ((uint)(uVar9 >> 3) & 0x1fffffff) + iVar11;
          goto LAB_0011a260;
        }
LAB_0011a1f5:
        if ((puVar36 < src + ((ulong)(uint)srcSize - 8)) && ((int)*puVar15 == (int)*puVar36)) {
          puVar36 = (ulong *)((long)puVar36 + 4);
          puVar15 = (ulong *)((long)puVar15 + 4);
        }
        if ((puVar36 < src + ((ulong)(uint)srcSize - 6)) && ((short)*puVar15 == (short)*puVar36)) {
          puVar36 = (ulong *)((long)puVar36 + 2);
          puVar15 = (ulong *)((long)puVar15 + 2);
        }
        if (puVar36 < src + ((ulong)(uint)srcSize - 5)) {
          puVar36 = (ulong *)((long)puVar36 + (ulong)((char)*puVar15 == (char)*puVar36));
        }
        uVar23 = (int)puVar36 - (int)puVar19;
      }
LAB_0011a260:
      if (pcVar31 < (char *)((long)psVar16 + (ulong)(uVar23 + 0xf0) / 0xff + 8)) {
        return 0;
      }
      local_b0 = psVar16 + 1;
      if (uVar23 < 0xf) {
        *(char *)psVar25 = (char)*psVar25 + (char)uVar23;
      }
      else {
        *(char *)psVar25 = (char)*psVar25 + '\x0f';
        uVar17 = (ushort)(uVar23 - 0xf);
        local_b0[0] = -1;
        local_b0[1] = -1;
        if (0x3fb < uVar23 - 0xf) {
          uVar17 = (ushort)((ulong)(uVar23 - 0x40b) % 0x3fc);
          uVar9 = (ulong)((uVar23 - 0x40b) / 0x3fc << 2);
          memset(psVar16 + 3,0xff,uVar9 + 4);
          local_b0 = (short *)((long)psVar16 + uVar9 + 6);
        }
        pcVar8 = (char *)((long)local_b0 + (ulong)(uVar17 / 0xff));
        local_b0 = (short *)(pcVar8 + 1);
        *pcVar8 = (char)(uVar17 % 0xff);
      }
      lVar34 = (long)piVar20 + (ulong)uVar23;
      local_b8 = (int *)(lVar34 + 4);
      if (src + ((ulong)(uint)srcSize - 0xb) <= local_b8) goto LAB_0011a7c0;
      *(short *)((long)state + (ulong)((uint)(*(int *)(lVar34 + 2) * -0x61c8864f) >> 0x13) * 2) =
           ((short)lVar34 + 2) - sVar2;
      uVar9 = (ulong)((uint)(*local_b8 * -0x61c8864f) >> 0x13);
      uVar17 = *(ushort *)((long)state + uVar9 * 2);
      pcVar8 = src + uVar17;
      *(short *)((long)state + uVar9 * 2) = (short)local_b8 - sVar2;
      if (*(int *)(src + uVar17) != *local_b8) goto LAB_00119fd7;
      psVar16 = (short *)((long)local_b0 + 1);
      *(char *)local_b0 = '\0';
      psVar25 = local_b0;
      piVar20 = local_b8;
    } while( true );
  }
LAB_001195b3:
  if (0 < dstCapacity) {
    *dst = '\0';
  }
  return (uint)(0 < dstCapacity);
code_r0x00119d49:
  puVar19 = puVar19 + 1;
  puVar15 = puVar15 + 1;
  goto LAB_00119d35;
LAB_00119ebf:
  plVar38 = (long *)((long)plVar35 + 2);
  if (plVar26 < plVar38) {
LAB_00119edf:
    pcVar31 = src + ((ulong)(uint)srcSize - (long)plVar35);
    if (pcVar31 < (char *)0xf) {
      *dst = (char)pcVar31 << 4;
    }
    else {
      pcVar8 = pcVar31 + -0xf;
      *dst = -0x10;
      pcVar10 = dst + 1;
      if ((char *)0xfe < pcVar8) {
        uVar9 = (ulong)(pcVar31 + -0x10e) / 0xff;
        memset(pcVar10,0xff,uVar9 + 1);
        pcVar8 = pcVar31 + uVar9 * -0xff + -0x10e;
        pcVar10 = dst + uVar9 + 2;
      }
      *pcVar10 = (char)pcVar8;
      dst = pcVar10;
    }
    memcpy(dst + 1,plVar35,(size_t)pcVar31);
    return ((int)(dst + 1) + (int)pcVar31) - iVar18;
  }
  goto LAB_00119b57;
code_r0x0011af24:
  puVar36 = puVar36 + 1;
  puVar15 = puVar15 + 1;
  if (puVar39 <= puVar36) goto LAB_0011b057;
  goto LAB_0011af19;
LAB_0011b0b6:
  piVar21 = (int *)((long)piVar20 + 2);
  if (piVar6 < piVar21) goto LAB_001194f9;
  goto LAB_0011ad38;
code_r0x0011a616:
  puVar19 = puVar19 + 1;
  puVar15 = puVar15 + 1;
  goto LAB_0011a602;
code_r0x001198bd:
  puVar36 = puVar36 + 1;
  puVar15 = puVar15 + 1;
  iVar11 = iVar11 + 8;
  if (puVar39 <= puVar36) goto LAB_001198cd;
  goto LAB_001198b1;
LAB_00119a6a:
  plVar35 = (long *)(lVar37 + 6);
  if (plVar26 < plVar35) goto LAB_0011b113;
  goto LAB_001196af;
code_r0x0011ab09:
  puVar36 = puVar36 + 1;
  puVar15 = puVar15 + 1;
  iVar11 = iVar11 + 8;
  if (puVar39 <= puVar36) goto LAB_0011ab19;
  goto LAB_0011aafd;
LAB_0011acad:
  plVar35 = (long *)(lVar37 + 6);
  if (plVar26 < plVar35) goto LAB_0011b113;
  goto LAB_0011a8fc;
code_r0x0011a1e5:
  puVar36 = puVar36 + 1;
  puVar15 = puVar15 + 1;
  iVar11 = iVar11 + 8;
  if (puVar39 <= puVar36) goto LAB_0011a1f5;
  goto LAB_0011a1d9;
}

Assistant:

int LZ4_compress_fast_extState_fastReset(void* state, const char* src, char* dst, int srcSize, int dstCapacity, int acceleration)
{
    LZ4_stream_t_internal* ctx = &((LZ4_stream_t*)state)->internal_donotuse;
    if (acceleration < 1) acceleration = LZ4_ACCELERATION_DEFAULT;
    if (acceleration > LZ4_ACCELERATION_MAX) acceleration = LZ4_ACCELERATION_MAX;

    if (dstCapacity >= LZ4_compressBound(srcSize)) {
        if (srcSize < LZ4_64Klimit) {
            const tableType_t tableType = byU16;
            LZ4_prepareTable(ctx, srcSize, tableType);
            if (ctx->currentOffset) {
                return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, 0, notLimited, tableType, noDict, dictSmall, acceleration);
            } else {
                return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, 0, notLimited, tableType, noDict, noDictIssue, acceleration);
            }
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)src > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            LZ4_prepareTable(ctx, srcSize, tableType);
            return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, 0, notLimited, tableType, noDict, noDictIssue, acceleration);
        }
    } else {
        if (srcSize < LZ4_64Klimit) {
            const tableType_t tableType = byU16;
            LZ4_prepareTable(ctx, srcSize, tableType);
            if (ctx->currentOffset) {
                return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, dstCapacity, limitedOutput, tableType, noDict, dictSmall, acceleration);
            } else {
                return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, dstCapacity, limitedOutput, tableType, noDict, noDictIssue, acceleration);
            }
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)src > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            LZ4_prepareTable(ctx, srcSize, tableType);
            return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, dstCapacity, limitedOutput, tableType, noDict, noDictIssue, acceleration);
        }
    }
}